

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_7::Validator::CheckLocalVar(Validator *this,Var *var,Type *out_type)

{
  Func *this_00;
  bool bVar1;
  Index IVar2;
  Index index_00;
  Type TVar3;
  string *this_01;
  undefined8 uVar4;
  Index num_params;
  Index index;
  Index max_index;
  Func *func;
  Type *out_type_local;
  Var *var_local;
  Validator *this_local;
  
  this_00 = this->current_func_;
  IVar2 = Func::GetNumParamsAndLocals(this_00);
  index_00 = Func::GetLocalIndex(this_00,var);
  if (index_00 < IVar2) {
    if (out_type != (Type *)0x0) {
      IVar2 = Func::GetNumParams(this_00);
      if (index_00 < IVar2) {
        TVar3 = Func::GetParamType(this_00,index_00);
        *out_type = TVar3;
      }
      else {
        TVar3 = LocalTypes::operator[](&this->current_func_->local_types,index_00 - IVar2);
        *out_type = TVar3;
      }
    }
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    bVar1 = Var::is_name(var);
    if (bVar1) {
      this_01 = Var::name_abi_cxx11_(var);
      uVar4 = std::__cxx11::string::c_str((string *)this_01);
      PrintError(this,&var->loc,"undefined local variable \"%s\"",uVar4);
    }
    else {
      PrintError(this,&var->loc,"local variable out of range (max %u)",(ulong)IVar2);
    }
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result Validator::CheckLocalVar(const Var* var, Type* out_type) {
  const Func* func = current_func_;
  Index max_index = func->GetNumParamsAndLocals();
  Index index = func->GetLocalIndex(*var);
  if (index < max_index) {
    if (out_type) {
      Index num_params = func->GetNumParams();
      if (index < num_params) {
        *out_type = func->GetParamType(index);
      } else {
        *out_type = current_func_->local_types[index - num_params];
      }
    }
    return Result::Ok;
  }

  if (var->is_name()) {
    PrintError(&var->loc, "undefined local variable \"%s\"",
               var->name().c_str());
  } else {
    PrintError(&var->loc, "local variable out of range (max %" PRIindex ")",
               max_index);
  }
  return Result::Error;
}